

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_recoverable_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_recoverable_signature *sig,uchar *input64,
              int recid)

{
  int iVar1;
  bool bVar2;
  int overflow;
  secp256k1_scalar s;
  secp256k1_scalar r;
  int local_6c;
  secp256k1_scalar local_68;
  secp256k1_scalar local_48;
  
  local_6c = 0;
  if (sig == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_3();
  }
  else if (input64 == (uchar *)0x0) {
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_2();
  }
  else {
    if ((uint)recid < 4) {
      secp256k1_scalar_set_b32(&local_48,input64,&local_6c);
      iVar1 = local_6c;
      secp256k1_scalar_set_b32(&local_68,input64 + 0x20,&local_6c);
      bVar2 = iVar1 == 0 && local_6c == 0;
      if (bVar2) {
        *(uint64_t *)(sig->data + 0x10) = local_48.d[2];
        *(uint64_t *)(sig->data + 0x18) = local_48.d[3];
        *(uint64_t *)sig->data = local_48.d[0];
        *(uint64_t *)(sig->data + 8) = local_48.d[1];
        *(uint64_t *)(sig->data + 0x20) = local_68.d[0];
        *(uint64_t *)(sig->data + 0x28) = local_68.d[1];
        *(uint64_t *)(sig->data + 0x30) = local_68.d[2];
        *(uint64_t *)(sig->data + 0x38) = local_68.d[3];
        sig->data[0x40] = (uchar)recid;
      }
      else {
        sig->data[0x30] = '\0';
        sig->data[0x31] = '\0';
        sig->data[0x32] = '\0';
        sig->data[0x33] = '\0';
        sig->data[0x34] = '\0';
        sig->data[0x35] = '\0';
        sig->data[0x36] = '\0';
        sig->data[0x37] = '\0';
        sig->data[0x38] = '\0';
        sig->data[0x39] = '\0';
        sig->data[0x3a] = '\0';
        sig->data[0x3b] = '\0';
        sig->data[0x3c] = '\0';
        sig->data[0x3d] = '\0';
        sig->data[0x3e] = '\0';
        sig->data[0x3f] = '\0';
        sig->data[0x20] = '\0';
        sig->data[0x21] = '\0';
        sig->data[0x22] = '\0';
        sig->data[0x23] = '\0';
        sig->data[0x24] = '\0';
        sig->data[0x25] = '\0';
        sig->data[0x26] = '\0';
        sig->data[0x27] = '\0';
        sig->data[0x28] = '\0';
        sig->data[0x29] = '\0';
        sig->data[0x2a] = '\0';
        sig->data[0x2b] = '\0';
        sig->data[0x2c] = '\0';
        sig->data[0x2d] = '\0';
        sig->data[0x2e] = '\0';
        sig->data[0x2f] = '\0';
        sig->data[0x10] = '\0';
        sig->data[0x11] = '\0';
        sig->data[0x12] = '\0';
        sig->data[0x13] = '\0';
        sig->data[0x14] = '\0';
        sig->data[0x15] = '\0';
        sig->data[0x16] = '\0';
        sig->data[0x17] = '\0';
        sig->data[0x18] = '\0';
        sig->data[0x19] = '\0';
        sig->data[0x1a] = '\0';
        sig->data[0x1b] = '\0';
        sig->data[0x1c] = '\0';
        sig->data[0x1d] = '\0';
        sig->data[0x1e] = '\0';
        sig->data[0x1f] = '\0';
        sig->data[0] = '\0';
        sig->data[1] = '\0';
        sig->data[2] = '\0';
        sig->data[3] = '\0';
        sig->data[4] = '\0';
        sig->data[5] = '\0';
        sig->data[6] = '\0';
        sig->data[7] = '\0';
        sig->data[8] = '\0';
        sig->data[9] = '\0';
        sig->data[10] = '\0';
        sig->data[0xb] = '\0';
        sig->data[0xc] = '\0';
        sig->data[0xd] = '\0';
        sig->data[0xe] = '\0';
        sig->data[0xf] = '\0';
        sig->data[0x40] = '\0';
      }
      goto LAB_0011d693;
    }
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_1();
  }
  bVar2 = false;
LAB_0011d693:
  return (int)bVar2;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_recoverable_signature* sig, const unsigned char *input64, int recid) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);
    ARG_CHECK(recid >= 0 && recid <= 3);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_recoverable_signature_save(sig, &r, &s, recid);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}